

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionals.cc
# Opt level: O0

PassDef * verona::conditionals(void)

{
  PassDef *in_RDI;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *local_28e0;
  DebugLocation local_2888;
  Token local_2880;
  Token local_2878;
  Pattern local_2870;
  Pattern local_27f8;
  Located<trieste::detail::Pattern> local_2780;
  undefined **local_26f8;
  DebugLocation local_26f0;
  Token local_26e8;
  Token local_26e0;
  Pattern local_26d8;
  Pattern local_2660;
  Located<trieste::detail::Pattern> local_25e8;
  undefined **local_2560;
  DebugLocation local_2558;
  Pattern local_2550;
  Token local_24d8;
  Pattern local_24d0;
  Pattern local_2458;
  Located<trieste::detail::Pattern> local_23e0;
  undefined **local_2358;
  DebugLocation local_2350;
  Pattern local_2348;
  Token local_22d0;
  Token local_22c8;
  Pattern local_22c0;
  Pattern local_2248;
  Token local_21d0;
  Pattern local_21c8;
  Pattern local_2150;
  Pattern local_20d8;
  Token local_2060;
  Pattern local_2058;
  Pattern local_1fe0;
  Located<trieste::detail::Pattern> local_1f68;
  undefined **local_1ee0;
  DebugLocation local_1ed8;
  Token local_1ed0;
  Pattern local_1ec8;
  Pattern local_1e50;
  Token local_1dd8;
  Token local_1dd0;
  Pattern local_1dc8;
  Pattern local_1d50;
  Token local_1cd8;
  Token local_1cd0;
  Pattern local_1cc8;
  Pattern local_1c50;
  Pattern local_1bd8;
  Token local_1b60;
  Pattern local_1b58;
  Pattern local_1ae0;
  Pattern local_1a68;
  Pattern local_19f0;
  Token local_1978;
  Pattern local_1970;
  Token local_18f8;
  Pattern local_18f0;
  Pattern local_1878;
  Pattern local_1800;
  Pattern local_1788;
  Pattern local_1710;
  Token local_1698;
  Pattern local_1690;
  Pattern local_1618;
  Located<trieste::detail::Pattern> local_15a0;
  undefined **local_1518;
  DebugLocation local_1510;
  Token local_1508;
  Token local_1500;
  Pattern local_14f8;
  Token local_1480;
  Pattern local_1478;
  Pattern local_1400;
  Pattern local_1388;
  Token local_1310;
  Pattern local_1308;
  Token local_1290;
  Pattern local_1288;
  Pattern local_1210;
  Pattern local_1198;
  Token local_1120;
  Pattern local_1118;
  Pattern local_10a0;
  Pattern local_1028;
  Token local_fb0;
  Pattern local_fa8;
  Token local_f30;
  Pattern local_f28;
  Pattern local_eb0;
  Pattern local_e38;
  Pattern local_dc0;
  Pattern local_d48;
  Pattern local_cd0;
  Pattern local_c58;
  Token local_be0;
  Token local_bd8;
  Pattern local_bd0;
  Pattern local_b58;
  Token local_ae0;
  Token local_ad8;
  Pattern local_ad0;
  Pattern local_a58;
  Pattern local_9e0;
  Token local_968;
  Pattern local_960;
  Pattern local_8e8;
  Pattern local_870;
  Pattern local_7f8;
  Token local_780;
  Pattern local_778;
  Token local_700;
  Pattern local_6f8;
  Pattern local_680;
  Pattern local_608;
  Pattern local_590;
  Pattern local_518;
  Located<trieste::detail::Pattern> local_4a0;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *local_420;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  local_418;
  undefined1 local_378 [160];
  undefined1 local_2d8 [160];
  undefined1 local_238 [160];
  undefined1 local_198 [160];
  undefined1 local_f8 [160];
  undefined1 local_58 [40];
  string local_30;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"conditionals",(allocator<char> *)(local_58 + 0x27));
  local_420 = &local_418;
  trieste::Token::Token(&local_700,(TokenDef *)Expr);
  trieste::In<>(&local_6f8,&local_700);
  trieste::Token::Token(&local_780,(TokenDef *)If);
  trieste::T(&local_778,&local_780);
  trieste::detail::Pattern::operator*(&local_680,&local_6f8,&local_778);
  trieste::Token::Token(&local_968,(TokenDef *)Lambda);
  trieste::T(&local_960,&local_968);
  trieste::detail::Pattern::operator!(&local_8e8,&local_960);
  trieste::Token::Token(&local_ad8,(TokenDef *)Lambda);
  trieste::T(&local_ad0,&local_ad8);
  trieste::detail::Pattern::operator!(&local_a58,&local_ad0);
  trieste::detail::Pattern::operator++(&local_9e0,&local_a58,0);
  trieste::detail::Pattern::operator*(&local_870,&local_8e8,&local_9e0);
  trieste::Token::Token(&local_ae0,(TokenDef *)Expr);
  trieste::detail::Pattern::operator[](&local_7f8,&local_870,&local_ae0);
  trieste::detail::Pattern::operator*(&local_608,&local_680,&local_7f8);
  trieste::Token::Token(&local_bd8,(TokenDef *)Lambda);
  trieste::T(&local_bd0,&local_bd8);
  trieste::Token::Token(&local_be0,(TokenDef *)Lhs);
  trieste::detail::Pattern::operator[](&local_b58,&local_bd0,&local_be0);
  trieste::detail::Pattern::operator*(&local_590,&local_608,&local_b58);
  trieste::Token::Token(&local_f30,(TokenDef *)Else);
  trieste::T(&local_f28,&local_f30);
  trieste::Token::Token(&local_fb0,(TokenDef *)If);
  trieste::T(&local_fa8,&local_fb0);
  trieste::detail::Pattern::operator*(&local_eb0,&local_f28,&local_fa8);
  trieste::Token::Token(&local_1120,(TokenDef *)Lambda);
  trieste::T(&local_1118,&local_1120);
  trieste::detail::Pattern::operator!(&local_10a0,&local_1118);
  trieste::Token::Token(&local_1290,(TokenDef *)Lambda);
  trieste::T(&local_1288,&local_1290);
  trieste::detail::Pattern::operator!(&local_1210,&local_1288);
  trieste::detail::Pattern::operator++(&local_1198,&local_1210,0);
  trieste::detail::Pattern::operator*(&local_1028,&local_10a0,&local_1198);
  trieste::detail::Pattern::operator*(&local_e38,&local_eb0,&local_1028);
  trieste::Token::Token(&local_1310,(TokenDef *)Lambda);
  trieste::T(&local_1308,&local_1310);
  trieste::detail::Pattern::operator*(&local_dc0,&local_e38,&local_1308);
  trieste::detail::Pattern::operator++(&local_d48,&local_dc0,0);
  trieste::Token::Token(&local_1480,(TokenDef *)Else);
  trieste::T(&local_1478,&local_1480);
  trieste::Token::Token(&local_1500,(TokenDef *)Lambda);
  trieste::T(&local_14f8,&local_1500);
  trieste::detail::Pattern::operator*(&local_1400,&local_1478,&local_14f8);
  trieste::detail::Pattern::operator~(&local_1388,&local_1400);
  trieste::detail::Pattern::operator*(&local_cd0,&local_d48,&local_1388);
  trieste::Token::Token(&local_1508,(TokenDef *)Rhs);
  trieste::detail::Pattern::operator[](&local_c58,&local_cd0,&local_1508);
  trieste::detail::Pattern::operator*(&local_518,&local_590,&local_c58);
  local_1518 = &PTR_s__workspace_llm4binary_github_lic_0049bfc0;
  trieste::detail::DebugLocation::DebugLocation(&local_1510,(source_location)0x49bfc0);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_4a0,&local_518,local_1510);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_conditionals_cc:89:11)>
            (&local_418,&local_4a0);
  local_420 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_378;
  trieste::Token::Token(&local_1698,(TokenDef *)Conditional);
  trieste::T(&local_1690,&local_1698);
  trieste::Token::Token(&local_18f8,(TokenDef *)Else);
  trieste::T(&local_18f0,&local_18f8);
  trieste::Token::Token(&local_1978,(TokenDef *)If);
  trieste::T(&local_1970,&local_1978);
  trieste::detail::Pattern::operator*(&local_1878,&local_18f0,&local_1970);
  trieste::Token::Token(&local_1b60,(TokenDef *)Lambda);
  trieste::T(&local_1b58,&local_1b60);
  trieste::detail::Pattern::operator!(&local_1ae0,&local_1b58);
  trieste::Token::Token(&local_1cd0,(TokenDef *)Lambda);
  trieste::T(&local_1cc8,&local_1cd0);
  trieste::detail::Pattern::operator!(&local_1c50,&local_1cc8);
  trieste::detail::Pattern::operator++(&local_1bd8,&local_1c50,0);
  trieste::detail::Pattern::operator*(&local_1a68,&local_1ae0,&local_1bd8);
  trieste::Token::Token(&local_1cd8,(TokenDef *)Expr);
  trieste::detail::Pattern::operator[](&local_19f0,&local_1a68,&local_1cd8);
  trieste::detail::Pattern::operator*(&local_1800,&local_1878,&local_19f0);
  trieste::Token::Token(&local_1dd0,(TokenDef *)Lambda);
  trieste::T(&local_1dc8,&local_1dd0);
  trieste::Token::Token(&local_1dd8,(TokenDef *)Lhs);
  trieste::detail::Pattern::operator[](&local_1d50,&local_1dc8,&local_1dd8);
  trieste::detail::Pattern::operator*(&local_1788,&local_1800,&local_1d50);
  trieste::detail::Pattern::operator++(&local_1ec8,(Pattern *)trieste::Any,0);
  trieste::Token::Token(&local_1ed0,(TokenDef *)Rhs);
  trieste::detail::Pattern::operator[](&local_1e50,&local_1ec8,&local_1ed0);
  trieste::detail::Pattern::operator*(&local_1710,&local_1788,&local_1e50);
  trieste::detail::Pattern::operator<<(&local_1618,&local_1690,&local_1710);
  local_1ee0 = &PTR_s__workspace_llm4binary_github_lic_0049bfd8;
  trieste::detail::DebugLocation::DebugLocation(&local_1ed8,(source_location)0x49bfd8);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_15a0,&local_1618,local_1ed8);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_conditionals_cc:95:11)>
            (local_378,&local_15a0);
  local_420 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_2d8;
  trieste::Token::Token(&local_2060,(TokenDef *)Conditional);
  trieste::T(&local_2058,&local_2060);
  trieste::Token::Token(&local_21d0,(TokenDef *)Else);
  trieste::T(&local_21c8,&local_21d0);
  trieste::Token::Token(&local_22c8,(TokenDef *)Lambda);
  trieste::T(&local_22c0,&local_22c8);
  trieste::Token::Token(&local_22d0,(TokenDef *)Rhs);
  trieste::detail::Pattern::operator[](&local_2248,&local_22c0,&local_22d0);
  trieste::detail::Pattern::operator*(&local_2150,&local_21c8,&local_2248);
  trieste::detail::Pattern::Pattern(&local_2348,(Pattern *)trieste::End);
  trieste::detail::Pattern::operator*(&local_20d8,&local_2150,&local_2348);
  trieste::detail::Pattern::operator<<(&local_1fe0,&local_2058,&local_20d8);
  local_2358 = &PTR_s__workspace_llm4binary_github_lic_0049bff0;
  trieste::detail::DebugLocation::DebugLocation(&local_2350,(source_location)0x49bff0);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_1f68,&local_1fe0,local_2350);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_conditionals_cc:98:11)>
            (local_2d8,&local_1f68);
  local_420 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_238;
  trieste::Token::Token(&local_24d8,(TokenDef *)Conditional);
  trieste::T(&local_24d0,&local_24d8);
  trieste::detail::Pattern::Pattern(&local_2550,(Pattern *)trieste::End);
  trieste::detail::Pattern::operator<<(&local_2458,&local_24d0,&local_2550);
  local_2560 = &PTR_s__workspace_llm4binary_github_lic_0049c008;
  trieste::detail::DebugLocation::DebugLocation(&local_2558,(source_location)0x49c008);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_23e0,&local_2458,local_2558);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_conditionals_cc:100:35)>
            (local_238,&local_23e0);
  local_420 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_198;
  trieste::Token::Token(&local_26e0,(TokenDef *)If);
  trieste::T(&local_26d8,&local_26e0);
  trieste::Token::Token(&local_26e8,(TokenDef *)If);
  trieste::detail::Pattern::operator[](&local_2660,&local_26d8,&local_26e8);
  local_26f8 = &PTR_s__workspace_llm4binary_github_lic_0049c020;
  trieste::detail::DebugLocation::DebugLocation(&local_26f0,(source_location)0x49c020);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_25e8,&local_2660,local_26f0);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_conditionals_cc:103:11)>
            (local_198,&local_25e8);
  local_420 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
               *)local_f8;
  trieste::Token::Token(&local_2878,(TokenDef *)Else);
  trieste::T(&local_2870,&local_2878);
  trieste::Token::Token(&local_2880,(TokenDef *)Else);
  trieste::detail::Pattern::operator[](&local_27f8,&local_2870,&local_2880);
  trieste::detail::DebugLocation::DebugLocation(&local_2888,(source_location)0x49c038);
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_2780,&local_27f8,local_2888);
  trieste::
  operator>><(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]verona_src_passes_conditionals_cc:109:11)>
            (local_f8,&local_2780);
  local_58._0_8_ = &local_418;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
  trieste::PassDef::PassDef
            (in_RDI,&local_30,(Wellformed *)wfPassConditionals,2,
             (initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
              *)local_58);
  local_28e0 = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
                *)local_58;
  do {
    local_28e0 = local_28e0 + -1;
    ::std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair(local_28e0);
  } while (local_28e0 != &local_418);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_2780);
  trieste::detail::Pattern::~Pattern(&local_27f8);
  trieste::detail::Pattern::~Pattern(&local_2870);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_25e8);
  trieste::detail::Pattern::~Pattern(&local_2660);
  trieste::detail::Pattern::~Pattern(&local_26d8);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_23e0);
  trieste::detail::Pattern::~Pattern(&local_2458);
  trieste::detail::Pattern::~Pattern(&local_2550);
  trieste::detail::Pattern::~Pattern(&local_24d0);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_1f68);
  trieste::detail::Pattern::~Pattern(&local_1fe0);
  trieste::detail::Pattern::~Pattern(&local_20d8);
  trieste::detail::Pattern::~Pattern(&local_2348);
  trieste::detail::Pattern::~Pattern(&local_2150);
  trieste::detail::Pattern::~Pattern(&local_2248);
  trieste::detail::Pattern::~Pattern(&local_22c0);
  trieste::detail::Pattern::~Pattern(&local_21c8);
  trieste::detail::Pattern::~Pattern(&local_2058);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_15a0);
  trieste::detail::Pattern::~Pattern(&local_1618);
  trieste::detail::Pattern::~Pattern(&local_1710);
  trieste::detail::Pattern::~Pattern(&local_1e50);
  trieste::detail::Pattern::~Pattern(&local_1ec8);
  trieste::detail::Pattern::~Pattern(&local_1788);
  trieste::detail::Pattern::~Pattern(&local_1d50);
  trieste::detail::Pattern::~Pattern(&local_1dc8);
  trieste::detail::Pattern::~Pattern(&local_1800);
  trieste::detail::Pattern::~Pattern(&local_19f0);
  trieste::detail::Pattern::~Pattern(&local_1a68);
  trieste::detail::Pattern::~Pattern(&local_1bd8);
  trieste::detail::Pattern::~Pattern(&local_1c50);
  trieste::detail::Pattern::~Pattern(&local_1cc8);
  trieste::detail::Pattern::~Pattern(&local_1ae0);
  trieste::detail::Pattern::~Pattern(&local_1b58);
  trieste::detail::Pattern::~Pattern(&local_1878);
  trieste::detail::Pattern::~Pattern(&local_1970);
  trieste::detail::Pattern::~Pattern(&local_18f0);
  trieste::detail::Pattern::~Pattern(&local_1690);
  trieste::detail::Located<trieste::detail::Pattern>::~Located(&local_4a0);
  trieste::detail::Pattern::~Pattern(&local_518);
  trieste::detail::Pattern::~Pattern(&local_c58);
  trieste::detail::Pattern::~Pattern(&local_cd0);
  trieste::detail::Pattern::~Pattern(&local_1388);
  trieste::detail::Pattern::~Pattern(&local_1400);
  trieste::detail::Pattern::~Pattern(&local_14f8);
  trieste::detail::Pattern::~Pattern(&local_1478);
  trieste::detail::Pattern::~Pattern(&local_d48);
  trieste::detail::Pattern::~Pattern(&local_dc0);
  trieste::detail::Pattern::~Pattern(&local_1308);
  trieste::detail::Pattern::~Pattern(&local_e38);
  trieste::detail::Pattern::~Pattern(&local_1028);
  trieste::detail::Pattern::~Pattern(&local_1198);
  trieste::detail::Pattern::~Pattern(&local_1210);
  trieste::detail::Pattern::~Pattern(&local_1288);
  trieste::detail::Pattern::~Pattern(&local_10a0);
  trieste::detail::Pattern::~Pattern(&local_1118);
  trieste::detail::Pattern::~Pattern(&local_eb0);
  trieste::detail::Pattern::~Pattern(&local_fa8);
  trieste::detail::Pattern::~Pattern(&local_f28);
  trieste::detail::Pattern::~Pattern(&local_590);
  trieste::detail::Pattern::~Pattern(&local_b58);
  trieste::detail::Pattern::~Pattern(&local_bd0);
  trieste::detail::Pattern::~Pattern(&local_608);
  trieste::detail::Pattern::~Pattern(&local_7f8);
  trieste::detail::Pattern::~Pattern(&local_870);
  trieste::detail::Pattern::~Pattern(&local_9e0);
  trieste::detail::Pattern::~Pattern(&local_a58);
  trieste::detail::Pattern::~Pattern(&local_ad0);
  trieste::detail::Pattern::~Pattern(&local_8e8);
  trieste::detail::Pattern::~Pattern(&local_960);
  trieste::detail::Pattern::~Pattern(&local_680);
  trieste::detail::Pattern::~Pattern(&local_778);
  trieste::detail::Pattern::~Pattern(&local_6f8);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_58 + 0x27));
  return in_RDI;
}

Assistant:

PassDef conditionals()
  {
    return {
      "conditionals",
      wfPassConditionals,
      dir::topdown,
      {
        // Conditionals are right-associative.
        In(Expr) * T(If) * (!T(Lambda) * (!T(Lambda))++)[Expr] *
            T(Lambda)[Lhs] *
            ((T(Else) * T(If) * (!T(Lambda) * (!T(Lambda))++) * T(Lambda))++ *
             ~(T(Else) * T(Lambda)))[Rhs] >>
          [](Match& _) { return make_conditional(_); },

        T(Conditional)
            << ((T(Else) * T(If) * (!T(Lambda) * (!T(Lambda))++)[Expr] *
                 T(Lambda)[Lhs]) *
                Any++[Rhs]) >>
          [](Match& _) { return make_conditional(_); },

        T(Conditional) << (T(Else) * T(Lambda)[Rhs] * End) >>
          [](Match& _) { return Seq << _(Rhs) << Unit; },

        T(Conditional) << End >> ([](Match&) -> Node { return Unit; }),

        T(If)[If] >>
          [](Match& _) {
            return err(
              _(If), "`if` must be followed by a condition and braces");
          },

        T(Else)[Else] >>
          [](Match& _) {
            return err(
              _(Else),
              "`else` must follow an `if` and be followed by an `if` or "
              "braces");
          },
      }};
  }